

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FConsoleAlias::Archive(FConsoleAlias *this,FConfigFile *f)

{
  bool bVar1;
  char *value;
  FConfigFile *f_local;
  FConsoleAlias *this_local;
  
  if (f != (FConfigFile *)0x0) {
    bVar1 = FString::IsEmpty(this->m_Command);
    if (!bVar1) {
      FConfigFile::SetValueForKey(f,"Name",(this->super_FConsoleCommand).m_Name,true);
      value = FString::operator_cast_to_char_(this->m_Command);
      FConfigFile::SetValueForKey(f,"Command",value,true);
    }
  }
  return;
}

Assistant:

void FConsoleAlias::Archive (FConfigFile *f)
{
	if (f != NULL && !m_Command[0].IsEmpty())
	{
		f->SetValueForKey ("Name", m_Name, true);
		f->SetValueForKey ("Command", m_Command[0], true);
	}
}